

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O0

Fluid_Image * Fluid_Image::find(char *iname)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  int local_64;
  Fluid_Image *local_38;
  Fluid_Image *ret;
  FILE *f;
  int i;
  int c;
  int b;
  int a;
  char *iname_local;
  
  if ((iname == (char *)0x0) || (*iname == '\0')) {
    iname_local = (char *)0x0;
  }
  else {
    c = 0;
    i = numimages;
    iVar1 = i;
    while (i = iVar1, c < i) {
      iVar1 = (c + i) / 2;
      iVar2 = strcmp(iname,images[iVar1]->name_);
      if (-1 < iVar2) {
        if (iVar2 < 1) {
          return images[iVar1];
        }
        c = iVar1 + 1;
        iVar1 = i;
      }
    }
    goto_source_dir();
    __stream = (FILE *)fl_fopen(iname,"rb");
    if (__stream == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      read_error("%s : %s",iname,pcVar4);
      leave_source_dir();
      iname_local = (char *)0x0;
    }
    else {
      fclose(__stream);
      local_38 = (Fluid_Image *)operator_new(0x28);
      Fluid_Image(local_38,iname);
      if (((local_38->img == (Fl_Shared_Image *)0x0) ||
          (iVar1 = Fl_Image::w(&local_38->img->super_Fl_Image), iVar1 == 0)) ||
         (iVar1 = Fl_Image::h(&local_38->img->super_Fl_Image), iVar1 == 0)) {
        if (local_38 != (Fluid_Image *)0x0) {
          ~Fluid_Image(local_38);
          operator_delete(local_38,0x28);
        }
        local_38 = (Fluid_Image *)0x0;
        read_error("%s : unrecognized image format",iname);
      }
      leave_source_dir();
      if (local_38 == (Fluid_Image *)0x0) {
        iname_local = (char *)0x0;
      }
      else {
        numimages = numimages + 1;
        iVar1 = numimages;
        if (tablesize < numimages) {
          if (tablesize == 0) {
            local_64 = 0x10;
          }
          else {
            local_64 = tablesize << 1;
          }
          tablesize = local_64;
          if (images == (Fluid_Image **)0x0) {
            images = (Fluid_Image **)malloc((long)local_64 << 3);
            iVar1 = numimages;
          }
          else {
            images = (Fluid_Image **)realloc(images,(long)local_64 << 3);
            iVar1 = numimages;
          }
        }
        while (i = iVar1 + -1, c < i) {
          images[i] = images[iVar1 + -2];
          iVar1 = i;
        }
        images[c] = local_38;
        iname_local = (char *)local_38;
      }
    }
  }
  return (Fluid_Image *)iname_local;
}

Assistant:

Fluid_Image* Fluid_Image::find(const char *iname) {
  if (!iname || !*iname) return 0;

  // first search to see if it exists already:
  int a = 0;
  int b = numimages;
  while (a < b) {
    int c = (a+b)/2;
    int i = strcmp(iname,images[c]->name_);
    if (i < 0) b = c;
    else if (i > 0) a = c+1;
    else return images[c];
  }

  // no, so now see if the file exists:

  goto_source_dir();
  FILE *f = fl_fopen(iname,"rb");
  if (!f) {
    read_error("%s : %s",iname,strerror(errno));
    leave_source_dir();
    return 0;
  }
  fclose(f);

  Fluid_Image *ret = new Fluid_Image(iname);

  if (!ret->img || !ret->img->w() || !ret->img->h()) {
    delete ret;
    ret = 0;
    read_error("%s : unrecognized image format", iname);
  }
  leave_source_dir();
  if (!ret) return 0;

  // make a new entry in the table:
  numimages++;
  if (numimages > tablesize) {
    tablesize = tablesize ? 2*tablesize : 16;
    if (images) images = (Fluid_Image**)realloc(images, tablesize*sizeof(Fluid_Image*));
    else images = (Fluid_Image**)malloc(tablesize*sizeof(Fluid_Image*));
  }
  for (b = numimages-1; b > a; b--) images[b] = images[b-1];
  images[a] = ret;

  return ret;
}